

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElabVisitors.h
# Opt level: O0

void __thiscall
slang::ast::DiagnosticVisitor::handle(DiagnosticVisitor *this,CheckerInstanceBodySymbol *symbol)

{
  uint uVar1;
  bool bVar2;
  CompilationOptions *pCVar3;
  long in_RSI;
  DiagnosticVisitor *in_RDI;
  CheckerInstanceBodySymbol *in_stack_00000008;
  ASTVisitor<slang::ast::DiagnosticVisitor,_false,_false,_false,_false> *in_stack_00000010;
  
  if (((in_RDI->visitInstances & 1U) != 0) && (bVar2 = finishedEarly(in_RDI), !bVar2)) {
    uVar1 = *(uint *)(in_RSI + 0x90);
    pCVar3 = Compilation::getOptions(in_RDI->compilation);
    if (pCVar3->maxCheckerInstanceDepth < uVar1) {
      in_RDI->hierarchyProblem = true;
    }
    else {
      ASTVisitor<slang::ast::DiagnosticVisitor,_false,_false,_false,_false>::
      visitDefault<slang::ast::CheckerInstanceBodySymbol>(in_stack_00000010,in_stack_00000008);
    }
  }
  return;
}

Assistant:

void handle(const CheckerInstanceBodySymbol& symbol) {
        if (!visitInstances || finishedEarly())
            return;

        if (symbol.instanceDepth > compilation.getOptions().maxCheckerInstanceDepth) {
            hierarchyProblem = true;
            return;
        }

        visitDefault(symbol);
    }